

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O2

ion_err_t ffdict_close_dictionary(ion_dictionary_t *dictionary)

{
  ion_err_t iVar1;
  
  iVar1 = flat_file_close((ion_flat_file_t *)dictionary->instance);
  free(dictionary->instance);
  dictionary->instance = (ion_dictionary_parent_t *)0x0;
  return iVar1;
}

Assistant:

ion_err_t
ffdict_close_dictionary(
	ion_dictionary_t *dictionary
) {
	ion_err_t err = flat_file_close((ion_flat_file_t *) dictionary->instance);

	free(dictionary->instance);
	dictionary->instance = NULL;

	if (err_ok != err) {
		return err;
	}

	return err_ok;
}